

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

int __thiscall deqp::egl::PartialUpdateTests::init(PartialUpdateTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  undefined8 oddFrameDrawType_00;
  int extraout_EAX;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *pvVar1;
  reference oddFrameDrawType_01;
  size_type sVar2;
  PartialUpdateTest *this_00;
  char *name_00;
  TestNode *pTVar3;
  undefined1 local_168 [8];
  string name;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *oddFrameDrawType;
  size_t oddNdx;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *evenFrameDrawType;
  size_t evenNdx;
  value_type local_120;
  allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> local_101;
  value_type local_100;
  allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> local_e5;
  value_type local_e4;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  local_e0;
  allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> local_c5;
  value_type local_c4;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  local_c0;
  allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> local_a5;
  value_type local_a4;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  local_a0;
  allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> local_85;
  value_type local_84;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  local_80;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  local_58;
  undefined1 local_38 [8];
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  frameDrawTypes;
  DrawType renderClear [2];
  DrawType clearRender [2];
  PartialUpdateTests *this_local;
  
  renderClear[0] = DRAWTYPE_GLES2_CLEAR;
  renderClear[1] = DRAWTYPE_GLES2_RENDER;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
  clearRender = (DrawType  [2])this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::vector((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
            *)local_38);
  local_58.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&local_58);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_58);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_58);
  local_84 = DRAWTYPE_GLES2_CLEAR;
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::allocator
            (&local_85);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&local_80,1,&local_84,&local_85);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_80);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_80);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::~allocator
            (&local_85);
  local_a4 = DRAWTYPE_GLES2_RENDER;
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::allocator
            (&local_a5);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&local_a0,1,&local_a4,&local_a5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_a0);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_a0);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::~allocator
            (&local_a5);
  local_c4 = DRAWTYPE_GLES2_CLEAR;
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::allocator
            (&local_c5);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&local_c0,2,&local_c4,&local_c5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_c0);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_c0);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::~allocator
            (&local_c5);
  local_e4 = DRAWTYPE_GLES2_RENDER;
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::allocator
            (&local_e5);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::vector(&local_e0,2,&local_e4,&local_e5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_e0);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_e0);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::~allocator
            (&local_e5);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::allocator
            (&local_101);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
              *)&local_100,renderClear,clearRender,&local_101);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_100);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_100);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::~allocator
            (&local_101);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::allocator
            ((allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> *)
             ((long)&evenNdx + 7));
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
              *)&local_120,
             (DrawType *)
             &frameDrawTypes.
              super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,renderClear,
             (allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> *)
             ((long)&evenNdx + 7));
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
               *)local_38,&local_120);
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ::~vector(&local_120);
  std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>::~allocator
            ((allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType> *)
             ((long)&evenNdx + 7));
  for (evenFrameDrawType =
            (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
             *)0x0;
      pvVar1 = (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                *)std::
                  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                  ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                          *)local_38), evenFrameDrawType < pvVar1;
      evenFrameDrawType =
           (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            *)((long)&(evenFrameDrawType->
                      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1)) {
    oddFrameDrawType_01 =
         std::
         vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
         ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                       *)local_38,(size_type)evenFrameDrawType);
    for (oddFrameDrawType = evenFrameDrawType;
        pvVar1 = (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                  *)std::
                    vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                    ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                            *)local_38), oddFrameDrawType < pvVar1;
        oddFrameDrawType =
             (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              *)((long)&(oddFrameDrawType->
                        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1)) {
      name.field_2._8_8_ =
           std::
           vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
           ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                         *)local_38,(size_type)oddFrameDrawType);
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                ((string *)local_168,(_anonymous_namespace_ *)name.field_2._8_8_,oddFrameDrawType_01
                 ,pvVar1);
      sVar2 = std::
              vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
              ::size((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      *)name.field_2._8_8_);
      if ((sVar2 != 0) ||
         (sVar2 = std::
                  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                  ::size(oddFrameDrawType_01), sVar2 != 0)) {
        this_00 = (PartialUpdateTest *)operator_new(0x1b18);
        oddFrameDrawType_00 = name.field_2._8_8_;
        eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
        name_00 = (char *)std::__cxx11::string::c_str();
        egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
                  (this_00,eglTestCtx,
                   (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    *)oddFrameDrawType_00,oddFrameDrawType_01,name_00,"");
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      }
      std::__cxx11::string::~string((string *)local_168);
    }
  }
  pTVar3 = (TestNode *)operator_new(0x1b18);
  egl::anon_unknown_0::RenderOutsideDamageRegion::RenderOutsideDamageRegion
            ((RenderOutsideDamageRegion *)pTVar3,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x1b18);
  egl::anon_unknown_0::RenderBeforeSetDamageRegion::RenderBeforeSetDamageRegion
            ((RenderBeforeSetDamageRegion *)pTVar3,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::~vector((vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
             *)local_38);
  return extraout_EAX;
}

Assistant:

void PartialUpdateTests::init (void)
{
	const PartialUpdateTest::DrawType clearRender[2] =
	{
		PartialUpdateTest::DRAWTYPE_GLES2_CLEAR,
		PartialUpdateTest::DRAWTYPE_GLES2_RENDER
	};

	const PartialUpdateTest::DrawType renderClear[2] =
	{
		PartialUpdateTest::DRAWTYPE_GLES2_RENDER,
		PartialUpdateTest::DRAWTYPE_GLES2_CLEAR
	};

	vector< vector<PartialUpdateTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> ());
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (1, PartialUpdateTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (1, PartialUpdateTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (2, PartialUpdateTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (2, PartialUpdateTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
	{
		const vector<PartialUpdateTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

		for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
		{
			const vector<PartialUpdateTest::DrawType>&	oddFrameDrawType = frameDrawTypes[oddNdx];
			const std::string							name			 = generateTestName(oddFrameDrawType, evenFrameDrawType);
			if (oddFrameDrawType.size() == 0 && evenFrameDrawType.size() == 0)
				continue;

			addChild(new PartialUpdateTest(m_eglTestCtx, oddFrameDrawType, evenFrameDrawType, name.c_str(), ""));
		}
	}
	addChild(new RenderOutsideDamageRegion(m_eglTestCtx));
	addChild(new RenderBeforeSetDamageRegion(m_eglTestCtx));
}